

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
ColumnSampler<double>::initialize<double>(ColumnSampler<double> *this,double *weights,size_t n_cols)

{
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  uint64_t uVar1;
  pointer pdVar2;
  pointer pdVar3;
  size_t sVar4;
  double *pdVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  size_t sVar9;
  bool bVar10;
  double dVar11;
  value_type_conflict local_20;
  
  this->n_cols = n_cols;
  uVar6 = n_cols - 1 >> 1 | n_cols - 1;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar6 = uVar6 >> 0x10 | uVar6;
  uVar6 = uVar6 >> 0x20 | uVar6;
  uVar1 = tab64[(uVar6 - (uVar6 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
  __new_size = uVar1 + 1;
  this->tree_levels = __new_size;
  this_00 = &this->tree_weights;
  pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  cVar7 = (char)uVar1;
  if (pdVar2 == pdVar3) {
    local_20 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (this_00,1L << (cVar7 + 2U & 0x3f),&local_20);
  }
  else {
    if ((long)pdVar3 - (long)pdVar2 >> 3 != 1L << (cVar7 + 2U & 0x3f)) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    }
    pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar3) {
      memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
    }
  }
  uVar6 = ~(-1L << ((byte)this->tree_levels & 0x3f));
  this->offset = uVar6;
  sVar4 = this->n_cols;
  if (sVar4 != 0) {
    pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      dVar11 = weights[sVar9];
      if (dVar11 <= 0.0) {
        dVar11 = 0.0;
      }
      pdVar2[uVar6 + sVar9] = dVar11;
      sVar9 = sVar9 + 1;
    } while (sVar4 != sVar9);
  }
  pdVar5 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
  if (lVar8 != 1) {
    uVar6 = lVar8 - 2;
    do {
      *(double *)((long)pdVar5 + (uVar6 & 0xfffffffffffffffe) * 4) =
           pdVar5[uVar6 + 1] + *(double *)((long)pdVar5 + (uVar6 & 0xfffffffffffffffe) * 4);
      bVar10 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar10);
  }
  if (*pdVar5 <= 0.0) {
    drop_weights(this);
  }
  this->n_dropped = 0;
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::initialize(real_t weights[], size_t n_cols)
{
    this->n_cols = n_cols;
    this->tree_levels = log2ceil(n_cols);
    if (this->tree_weights.empty())
        this->tree_weights.resize(pow2(this->tree_levels + 1), 0);
    else {
        if (this->tree_weights.size() != pow2(this->tree_levels + 1))
            this->tree_weights.resize(this->tree_levels);
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
    }

    /* compute sums for the tree leaves at each node */
    this->offset = pow2(this->tree_levels) - 1;
    for (size_t ix = 0; ix < this->n_cols; ix++)
        this->tree_weights[ix + this->offset] = std::fmax(0., weights[ix]);
    for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
        this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

    /* if the weights are invalid, make it an unweighted sampler */
    if (unlikely(std::isnan(this->tree_weights[0]) || this->tree_weights[0] <= 0))
    {
        this->drop_weights();
    }

    this->n_dropped = 0;
}